

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_gsub(lua_State *L)

{
  char cVar1;
  int tr_00;
  ulong uVar2;
  char *pcVar3;
  char *e_00;
  char *e;
  luaL_Buffer b;
  MatchState ms;
  size_t n;
  int anchor;
  size_t max_s;
  char *pcStack_30;
  int tr;
  char *p;
  char *src;
  size_t lp;
  size_t srcl;
  lua_State *L_local;
  
  srcl = (size_t)L;
  p = luaL_checklstring(L,1,&lp);
  pcStack_30 = luaL_checklstring((lua_State *)srcl,2,(size_t *)&src);
  tr_00 = lua_type((lua_State *)srcl,3);
  uVar2 = luaL_optinteger((lua_State *)srcl,4,lp + 1);
  cVar1 = *pcStack_30;
  ms.capture[0x1f].len = 0;
  if ((((tr_00 != 3) && (tr_00 != 4)) && (tr_00 != 6)) && (tr_00 != 5)) {
    luaL_argerror((lua_State *)srcl,3,"string/function/table expected");
  }
  luaL_buffinit((lua_State *)srcl,(luaL_Buffer *)&e);
  if (cVar1 == '^') {
    pcStack_30 = pcStack_30 + 1;
    src = src + -1;
  }
  b.initb[0x1ff8] = -0x38;
  b.initb[0x1ff9] = '\0';
  b.initb[0x1ffa] = '\0';
  b.initb[0x1ffb] = '\0';
  pcVar3 = p + lp;
  do {
    if (uVar2 <= (ulong)ms.capture[0x1f].len) break;
    e_00 = match((MatchState *)(b.initb + 0x1ff8),p,pcStack_30);
    if (e_00 == (char *)0x0) {
LAB_0012820d:
      if (pcVar3 <= p) break;
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)&e,1);
      }
      e[b.size] = *p;
      b.size = b.size + 1;
      e_00 = p + 1;
    }
    else {
      ms.capture[0x1f].len = ms.capture[0x1f].len + 1;
      add_value((MatchState *)(b.initb + 0x1ff8),(luaL_Buffer *)&e,p,e_00,tr_00);
      if (e_00 <= p) goto LAB_0012820d;
    }
    p = e_00;
  } while (cVar1 != '^');
  luaL_addlstring((luaL_Buffer *)&e,p,(long)pcVar3 - (long)p);
  luaL_pushresult((luaL_Buffer *)&e);
  lua_pushinteger((lua_State *)srcl,ms.capture[0x1f].len);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checklstring(L, 2, &lp);
  int tr = lua_type(L, 3);
  size_t max_s = luaL_optinteger(L, 4, srcl+1);
  int anchor = (*p == '^');
  size_t n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  ms.L = L;
  ms.matchdepth = MAXCCALLS;
  ms.src_init = src;
  ms.src_end = src+srcl;
  ms.p_end = p + lp;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    lua_assert(ms.matchdepth == MAXCCALLS);
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e, tr);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}